

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::updateEditorGeometries(QAbstractItemView *this)

{
  QHash<QWidget_*,_QPersistentModelIndex> *this_00;
  byte bVar1;
  long lVar2;
  long lVar3;
  QWidget *pQVar4;
  QObject *pQVar5;
  long lVar6;
  QRect QVar7;
  Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *pDVar8;
  long *plVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  Data *pDVar13;
  long in_FS_OFFSET;
  bool bVar14;
  QRect QVar15;
  piter it;
  QModelIndex local_188;
  QArrayData *local_168;
  long lStack_160;
  ulong local_158;
  QArrayData *local_148;
  long lStack_140;
  ulong local_138;
  void *local_128;
  undefined8 local_120;
  QWidget *local_118;
  undefined8 local_110;
  QStyleOptionViewItem local_108;
  long local_38;
  
  QVar7._8_8_ = local_108.super_QStyleOption.rect._8_8_;
  QVar7._0_8_ = local_108.super_QStyleOption.rect._0_8_;
  QVar15._8_8_ = local_108.super_QStyleOption.rect._8_8_;
  QVar15._0_8_ = local_108.super_QStyleOption.rect._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  if ((*(long *)(lVar2 + 0x340) != 0) &&
     (local_108.super_QStyleOption.rect = QVar15, *(long *)(*(long *)(lVar2 + 0x340) + 8) != 0)) {
    if (*(char *)(lVar2 + 0x492) == '\x01') {
      local_108.super_QStyleOption.rect = QVar7;
      if (*(int *)(lVar2 + 0x3a8) != 5) {
        QBasicTimer::stop();
        *(undefined1 *)(lVar2 + 0x492) = 0;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (**(code **)(**(long **)(lVar2 + 8) + 0x220))();
          return;
        }
        goto LAB_00541f15;
      }
    }
    else {
      this_00 = (QHash<QWidget_*,_QPersistentModelIndex> *)(lVar2 + 0x340);
      memset(&local_108,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
      (**(code **)(*(long *)this + 0x2f8))(this,&local_108);
      pDVar8 = this_00->d;
      if (pDVar8 == (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0) {
        pDVar13 = (Data *)0x0;
LAB_00541b06:
        sVar11 = 0;
      }
      else {
        if (1 < (uint)(pDVar8->ref).atomic._q_value.super___atomic_base<int>._M_i) {
          pDVar8 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_>::
                   detached(pDVar8);
          this_00->d = pDVar8;
        }
        pDVar13 = this_00->d;
        if (pDVar13->spans->offsets[0] != 0xff) goto LAB_00541b06;
        uVar10 = 1;
        do {
          sVar11 = uVar10;
          if (pDVar13->numBuckets == sVar11) {
            pDVar13 = (Data *)0x0;
            sVar11 = 0;
            break;
          }
          uVar10 = sVar11 + 1;
        } while (pDVar13->spans[sVar11 >> 7].offsets[(uint)sVar11 & 0x7f] == 0xff);
      }
      it.bucket = sVar11;
      it.d = pDVar13;
      local_148 = (QArrayData *)0x0;
      lStack_140 = 0;
      local_138 = 0;
      local_168 = (QArrayData *)0x0;
      lStack_160 = 0;
      local_158 = 0;
      if (pDVar13 != (Data *)0x0 || sVar11 != 0) {
        do {
          uVar12 = it.bucket;
          pDVar8 = it.d;
          local_188.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_188._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_188.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          lVar6 = (uVar12 >> 3 & 0xfffffffffffffff0) * 9;
          uVar10 = (ulong)((uint)it.bucket & 0x7f);
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    (&local_188,
                     (QPersistentModelIndex *)
                     (*(long *)(pDVar8->spans->offsets + lVar6 + 0x80) +
                      (ulong)pDVar8->spans->offsets[uVar10 + lVar6] * 0x10 + 8));
          bVar14 = false;
          if ((-1 < local_188.r) && (bVar14 = false, -1 < (long)local_188._0_8_)) {
            bVar14 = local_188.m.ptr != (QAbstractItemModel *)0x0;
          }
          lVar3 = *(long *)(pDVar8->spans->offsets + lVar6 + 0x80);
          bVar1 = pDVar8->spans->offsets[uVar10 + lVar6];
          pQVar4 = *(QWidget **)(lVar3 + (ulong)bVar1 * 0x10);
          if ((bVar14) && (pQVar4 != (QWidget *)0x0)) {
            QVar15 = (QRect)(**(code **)(*(long *)this + 0x1e0))(this,&local_188);
            local_108.super_QStyleOption.rect = QVar15;
            if (QVar15.x2.m_i.m_i < QVar15.x1.m_i.m_i) {
LAB_00541cb2:
              local_118 = pQVar4;
              QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                        ((QPodArrayOps<QWidget*> *)&local_168,local_158,&local_118);
              QList<QWidget_*>::end((QList<QWidget_*> *)&local_168);
            }
            else {
              local_108.super_QStyleOption.rect.y2 = QVar15.y2.m_i;
              local_108.super_QStyleOption.rect.y1 = QVar15.y1.m_i;
              if (local_108.super_QStyleOption.rect.y2.m_i <
                  local_108.super_QStyleOption.rect.y1.m_i) goto LAB_00541cb2;
              QWidget::show(pQVar4);
              plVar9 = (long *)(**(code **)(*(long *)this + 0x208))(this,&local_188);
              if (plVar9 != (long *)0x0) {
                (**(code **)(*plVar9 + 0x90))(plVar9,pQVar4,&local_108,&local_188);
              }
            }
            do {
              if (pDVar8->numBuckets - 1 == uVar12) {
                it = (piter)ZEXT816(0);
                break;
              }
              uVar12 = uVar12 + 1;
              it.bucket = uVar12;
              it.d = pDVar8;
            } while (pDVar8->spans[uVar12 >> 7].offsets[(uint)uVar12 & 0x7f] == 0xff);
          }
          else {
            QHash<QPersistentModelIndex,_QEditorInfo>::removeImpl<QPersistentModelIndex>
                      ((QHash<QPersistentModelIndex,_QEditorInfo> *)(lVar2 + 0x348),
                       (QPersistentModelIndex *)(lVar3 + (ulong)bVar1 * 0x10 + 8));
            it = (piter)QHash<QWidget_*,_QPersistentModelIndex>::erase(this_00,(const_iterator)it);
            local_118 = pQVar4;
            QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                      ((QPodArrayOps<QWidget*> *)&local_148,local_138,&local_118);
            QList<QWidget_*>::end((QList<QWidget_*> *)&local_148);
          }
        } while ((it.d != (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0) ||
                (it.bucket != 0));
      }
      if (local_158 != 0) {
        uVar10 = 0;
        do {
          QWidget::hide(*(QWidget **)(lStack_160 + uVar10 * 8));
          uVar10 = uVar10 + 1;
        } while (uVar10 < local_158);
      }
      if (local_138 != 0) {
        uVar10 = 0;
        do {
          pQVar4 = *(QWidget **)(lStack_140 + uVar10 * 8);
          local_188._0_8_ = (undefined1 *)0xffffffffffffffff;
          local_188.i = 0;
          local_188.m.ptr = (QAbstractItemModel *)0x0;
          if (pQVar4 != (QWidget *)0x0) {
            pQVar5 = *(QObject **)(lVar2 + 8);
            local_118 = (QWidget *)QObject::destroyed;
            local_110 = 0;
            local_128 = (void *)0x2a1;
            local_120 = 0;
            QObject::disconnectImpl
                      (&pQVar4->super_QObject,&local_118,pQVar5,&local_128,
                       (QMetaObject *)&QObject::staticMetaObject);
            QObject::removeEventFilter(&pQVar4->super_QObject);
            QWidget::hide(pQVar4);
            plVar9 = (long *)(**(code **)(*(long *)pQVar5 + 0x208))(pQVar5,&local_188);
            if (plVar9 == (long *)0x0) {
              QObject::deleteLater();
            }
            else {
              (**(code **)(*plVar9 + 0x78))(plVar9,pQVar4,&local_188);
            }
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < local_138);
      }
      if (local_168 != (QArrayData *)0x0) {
        LOCK();
        (local_168->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_168->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_168->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_168,8,0x10);
        }
      }
      if (local_148 != (QArrayData *)0x0) {
        LOCK();
        (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_148,8,0x10);
        }
      }
      QBrush::~QBrush(&local_108.backgroundBrush);
      if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
        }
      }
      QIcon::~QIcon(&local_108.icon);
      QLocale::~QLocale(&local_108.locale);
      QFont::~QFont(&local_108.font);
      QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00541f15:
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::updateEditorGeometries()
{
    Q_D(QAbstractItemView);
    if (d->editorIndexHash.isEmpty())
        return;
    if (d->delayedPendingLayout) {
        // doItemsLayout() will end up calling this function again
        d->executePostedLayout();
        return;
    }
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    QEditorIndexHash::iterator it = d->editorIndexHash.begin();
    QWidgetList editorsToRelease;
    QWidgetList editorsToHide;
    while (it != d->editorIndexHash.end()) {
        QModelIndex index = it.value();
        QWidget *editor = it.key();
        if (index.isValid() && editor) {
            option.rect = visualRect(index);
            if (option.rect.isValid()) {
                editor->show();
                QAbstractItemDelegate *delegate = itemDelegateForIndex(index);
                if (delegate)
                    delegate->updateEditorGeometry(editor, option, index);
            } else {
                editorsToHide << editor;
            }
            ++it;
        } else {
            d->indexEditorHash.remove(it.value());
            it = d->editorIndexHash.erase(it);
            editorsToRelease << editor;
        }
    }

    //we hide and release the editor outside of the loop because it might change the focus and try
    //to change the editors hashes.
    for (int i = 0; i < editorsToHide.size(); ++i) {
        editorsToHide.at(i)->hide();
    }
    for (int i = 0; i < editorsToRelease.size(); ++i) {
        d->releaseEditor(editorsToRelease.at(i));
    }
}